

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_init_finish.c
# Opt level: O2

Dwarf_Unsigned dwarf_get_section_count(Dwarf_Debug dbg)

{
  Dwarf_Obj_Access_Interface_a_s *pDVar1;
  Dwarf_Unsigned DVar2;
  
  if (((dbg != (Dwarf_Debug)0x0) && (dbg->de_magic == 0xebfdebfd)) &&
     (pDVar1 = dbg->de_obj_file, pDVar1 != (Dwarf_Obj_Access_Interface_a_s *)0x0)) {
    DVar2 = (*pDVar1->ai_methods->om_get_section_count)(pDVar1->ai_object);
    return DVar2;
  }
  return 0;
}

Assistant:

Dwarf_Unsigned
dwarf_get_section_count(Dwarf_Debug dbg)
{
    struct Dwarf_Obj_Access_Interface_a_s * obj = 0;

    if (IS_INVALID_DBG(dbg)) {
        return 0;
    }
    obj = dbg->de_obj_file;
    if (!obj) {
        /*  -1  */
        return 0;
    }
    return obj->ai_methods->om_get_section_count(obj->ai_object);
}